

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::get_opcode_string_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Nes *nes)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  IMmu *pIVar4;
  Opcode *pOVar5;
  v8 *pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  v8 *local_5e0;
  string_view local_568;
  basic_string_view<char,_std::char_traits<char>_> *local_558;
  char *local_550;
  string local_548;
  char *local_528;
  undefined8 local_520;
  string local_518;
  char *local_4f8;
  undefined8 local_4f0;
  string local_4e8;
  char *local_4c8;
  undefined8 local_4c0;
  string local_4b8;
  char *local_498;
  undefined8 local_490;
  string local_488;
  int local_454;
  char *pcStack_450;
  int arg_count;
  undefined8 local_448;
  undefined1 local_43c;
  undefined1 local_43b [2];
  undefined1 local_439;
  undefined1 auStack_438 [5];
  uint8_t op2;
  uint8_t op1;
  uint8_t raw_opcode;
  CpuState state;
  IMos6502 *cpu;
  Nes *nes_local;
  string *result;
  undefined1 local_3d0 [16];
  v8 *local_3c0;
  char *local_3b8;
  unsigned_short *local_3b0;
  v8 *local_3a8;
  char *local_3a0;
  undefined8 uStack_398;
  string *local_390;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char>
  *local_388 [2];
  undefined1 local_378 [16];
  v8 *local_368;
  char *local_360;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char> *local_358
  ;
  char *local_350;
  undefined8 uStack_348;
  string *local_340;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char>
  *local_338 [2];
  undefined1 local_328 [16];
  v8 *local_318;
  char *local_310;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char> *local_308
  ;
  char *local_300;
  undefined8 uStack_2f8;
  string *local_2f0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_2e8 [3];
  undefined1 local_2d0 [16];
  v8 *local_2c0;
  ulong local_2b8;
  char *local_2b0;
  undefined8 uStack_2a8;
  string *local_2a0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_298 [3];
  undefined1 local_280 [16];
  v8 *local_270;
  ulong local_268;
  char *local_260;
  undefined8 uStack_258;
  string *local_250;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[2],_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_248;
  undefined1 local_228 [16];
  basic_string_view<char,_std::char_traits<char>_> *local_218;
  char *local_210;
  string_view *local_208;
  v8 *local_200;
  basic_string_view<char,_std::char_traits<char>_> *local_1f8;
  char *pcStack_1f0;
  string *local_1e8;
  char **local_1e0;
  char *local_1d8;
  char *pcStack_1d0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_char>
  *local_1c0;
  undefined1 *local_1b8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_char>
  *local_1b0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_char>
  *local_1a8;
  undefined8 local_1a0;
  undefined1 *local_198;
  char **local_190;
  v8 *local_188;
  char *pcStack_180;
  char **local_170;
  v8 *local_168;
  char *pcStack_160;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char>
  **local_150;
  undefined1 *local_148;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char>
  **local_140;
  undefined8 local_138;
  undefined1 *local_130;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char>
  **local_128;
  undefined1 *local_120;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char>
  **local_118;
  undefined8 local_110;
  undefined1 *local_108;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char>
  **local_100;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char> **local_f8
  ;
  char **local_f0;
  v8 *local_e8;
  ulong uStack_e0;
  char **local_d0;
  char *local_c8;
  ulong uStack_c0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_b0;
  undefined1 *local_a8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_88;
  undefined1 *local_80;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_78;
  undefined8 local_70;
  undefined1 *local_68;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_60;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_58;
  basic_string_view<char,_std::char_traits<char>_> **local_50;
  basic_string_view<char,_std::char_traits<char>_> *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[2],_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[2],_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_28;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[2],_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_20;
  undefined8 local_18;
  undefined1 *local_10;
  undefined8 *puVar3;
  
  state.cycle = (uint64_t)n_e_s::nes::Nes::cpu((Nes *)this);
  iVar2 = (*(((IMos6502 *)state.cycle)->super_ICpu)._vptr_ICpu[4])();
  puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar2);
  state.start_cycle = puVar3[4];
  _auStack_438 = *puVar3;
  state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._0_8_ = puVar3[1];
  state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Opcode>._8_8_ = puVar3[2];
  state._16_8_ = puVar3[3];
  pvVar6 = (v8 *)((long)&state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>.
                         _M_payload.super__Optional_payload_base<n_e_s::core::Opcode>._M_payload + 8
                 );
  pIVar4 = n_e_s::nes::Nes::mmu((Nes *)this);
  iVar2 = (*pIVar4->_vptr_IMmu[3])
                    (pIVar4,state.current_opcode.
                            super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
                            super__Optional_payload_base<n_e_s::core::Opcode>._8_8_ & 0xffff);
  local_439 = (undefined1)iVar2;
  pIVar4 = n_e_s::nes::Nes::mmu((Nes *)this);
  iVar2 = (*pIVar4->_vptr_IMmu[3])
                    (pIVar4,(ulong)(ushort)(state.current_opcode.
                                            super__Optional_base<n_e_s::core::Opcode,_true,_true>.
                                            _M_payload.
                                            super__Optional_payload_base<n_e_s::core::Opcode>.
                                            _M_payload._8_2_ + 1));
  local_43b[1] = (undefined1)iVar2;
  pIVar4 = n_e_s::nes::Nes::mmu((Nes *)this);
  iVar2 = (*pIVar4->_vptr_IMmu[3])
                    (pIVar4,(ulong)(ushort)(state.current_opcode.
                                            super__Optional_base<n_e_s::core::Opcode,_true,_true>.
                                            _M_payload.
                                            super__Optional_payload_base<n_e_s::core::Opcode>.
                                            _M_payload._8_2_ + 2));
  local_43b[0] = (undefined1)iVar2;
  local_43c = 0;
  pcStack_450 = "{:04X}  {:02X}";
  local_448 = 0xe;
  local_3a0 = "{:04X}  {:02X}";
  uStack_398 = 0xe;
  local_3b0 = (unsigned_short *)&local_439;
  local_1e0 = &local_3a0;
  local_3c0 = (v8 *)0x175058;
  local_3b8 = (char *)0xe;
  local_3a8 = pvVar6;
  local_390 = __return_storage_ptr__;
  local_1d8 = (char *)local_3c0;
  pcStack_1d0 = local_3b8;
  ::fmt::v8::
  make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,unsigned_short_const&,unsigned_char_const&>
            ((format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_char>
              *)&result,pvVar6,local_3b0,(uchar *)"{:04X}  {:02X}");
  local_1b8 = local_3d0;
  local_1a0 = 0x22;
  fmt.size_ = 0x22;
  fmt.data_ = local_3b8;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)&result;
  pvVar6 = local_3c0;
  local_1c0 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_char>
               *)&result;
  local_1b0 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_char>
               *)&result;
  local_1a8 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_char>
               *)&result;
  local_198 = local_1b8;
  ::fmt::v8::vformat_abi_cxx11_(__return_storage_ptr__,local_3c0,fmt,args);
  pOVar5 = std::optional<n_e_s::core::Opcode>::operator->
                     ((optional<n_e_s::core::Opcode> *)auStack_438);
  local_454 = n_e_s::dis::get_arg_count(pOVar5->address_mode);
  if (local_454 < 1) {
    local_528 = "      ";
    local_520 = 6;
    local_2a0 = &local_518;
    local_2b0 = "      ";
    uStack_2a8 = 6;
    local_d0 = &local_2b0;
    local_2c0 = (v8 *)0x175067;
    local_2b8 = 6;
    local_c8 = (char *)local_2c0;
    uStack_c0 = local_2b8;
    local_2e8[0] = ::fmt::v8::
                   make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>>();
    local_80 = local_2d0;
    local_88 = local_2e8;
    local_70 = 0;
    fmt_03.size_ = 0;
    fmt_03.data_ = (char *)local_2b8;
    args_03.field_1.values_ = in_R9.values_;
    args_03.desc_ = (unsigned_long_long)local_88;
    local_78 = local_88;
    local_68 = local_80;
    local_60 = local_88;
    ::fmt::v8::vformat_abi_cxx11_(&local_518,local_2c0,fmt_03,args_03);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,&local_518);
    std::__cxx11::string::~string((string *)&local_518);
  }
  else {
    local_498 = " {:02X}";
    local_490 = 7;
    local_2f0 = &local_488;
    local_300 = " {:02X}";
    uStack_2f8 = 7;
    local_308 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char>
                 *)(local_43b + 1);
    local_190 = &local_300;
    local_318 = (v8 *)0x17505f;
    local_310 = (char *)0x7;
    local_188 = local_318;
    pcStack_180 = local_310;
    local_338[0] = ::fmt::v8::
                   make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,unsigned_char_const&>
                             (local_308,pvVar6,(uchar *)local_2f0);
    local_148 = local_328;
    local_150 = local_338;
    local_138 = 2;
    fmt_00.size_ = 2;
    fmt_00.data_ = local_310;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_150;
    local_140 = local_150;
    local_130 = local_148;
    local_f8 = local_150;
    ::fmt::v8::vformat_abi_cxx11_(&local_488,local_318,fmt_00,args_00);
    __str = &local_488;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,__str);
    std::__cxx11::string::~string((string *)&local_488);
    if (local_454 < 2) {
      local_4f8 = "   ";
      local_4f0 = 3;
      local_250 = &local_4e8;
      local_260 = "   ";
      uStack_258 = 3;
      local_f0 = &local_260;
      local_270 = (v8 *)0x17506a;
      local_268 = 3;
      local_e8 = local_270;
      uStack_e0 = local_268;
      local_298[0] = ::fmt::v8::
                     make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>>();
      local_a8 = local_280;
      local_b0 = local_298;
      local_98 = 0;
      fmt_02.size_ = 0;
      fmt_02.data_ = (char *)local_268;
      args_02.field_1.values_ = in_R9.values_;
      args_02.desc_ = (unsigned_long_long)local_b0;
      local_a0 = local_b0;
      local_90 = local_a8;
      local_58 = local_b0;
      ::fmt::v8::vformat_abi_cxx11_(&local_4e8,local_270,fmt_02,args_02);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,&local_4e8);
      std::__cxx11::string::~string((string *)&local_4e8);
    }
    else {
      local_4c8 = " {:02X}";
      local_4c0 = 7;
      local_340 = &local_4b8;
      local_350 = " {:02X}";
      uStack_348 = 7;
      local_358 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char>
                   *)local_43b;
      local_170 = &local_350;
      local_368 = (v8 *)0x17505f;
      local_360 = (char *)0x7;
      local_168 = local_368;
      pcStack_160 = local_360;
      local_388[0] = ::fmt::v8::
                     make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,unsigned_char_const&>
                               (local_358,(v8 *)__str,(uchar *)local_340);
      local_120 = local_378;
      local_128 = local_388;
      local_110 = 2;
      fmt_01.size_ = 2;
      fmt_01.data_ = local_360;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_128;
      local_118 = local_128;
      local_108 = local_120;
      local_100 = local_128;
      ::fmt::v8::vformat_abi_cxx11_(&local_4b8,local_368,fmt_01,args_01);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,&local_4b8);
      std::__cxx11::string::~string((string *)&local_4b8);
    }
  }
  local_558 = (basic_string_view<char,_std::char_traits<char>_> *)0x17506e;
  local_550 = (char *)0x5;
  pOVar5 = std::optional<n_e_s::core::Opcode>::operator*
                     ((optional<n_e_s::core::Opcode> *)auStack_438);
  bVar1 = anon_unknown.dwarf_53ee::is_undocumented(pOVar5);
  if (bVar1) {
    local_5e0 = (v8 *)0x175074;
  }
  else {
    local_5e0 = (v8 *)0x17506c;
  }
  pOVar5 = std::optional<n_e_s::core::Opcode>::operator->
                     ((optional<n_e_s::core::Opcode> *)auStack_438);
  local_568 = n_e_s::core::to_string(pOVar5->family);
  local_1e8 = &local_548;
  local_1f8 = local_558;
  pcStack_1f0 = local_550;
  local_200 = local_5e0;
  local_208 = &local_568;
  local_50 = &local_1f8;
  local_218 = local_558;
  local_210 = local_550;
  local_48 = local_218;
  pcStack_40 = local_210;
  ::fmt::v8::
  make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,char_const(&)[2],std::basic_string_view<char,std::char_traits<char>>&>
            (&local_248,local_5e0,(char (*) [2])local_208,local_558);
  local_30 = local_228;
  local_38 = &local_248;
  local_18 = 0xdc;
  fmt_04.size_ = 0xdc;
  fmt_04.data_ = local_210;
  args_04.field_1.values_ = in_R9.values_;
  args_04.desc_ = (unsigned_long_long)local_38;
  local_28 = local_38;
  local_20 = local_38;
  local_10 = local_30;
  ::fmt::v8::vformat_abi_cxx11_(&local_548,(v8 *)local_218,fmt_04,args_04);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,&local_548);
  std::__cxx11::string::~string((string *)&local_548);
  return __return_storage_ptr__;
}

Assistant:

std::string get_opcode_string(const n_e_s::nes::Nes &nes) {
    const n_e_s::core::IMos6502 &cpu = nes.cpu();
    const auto state = cpu.state();
    const std::uint8_t raw_opcode = nes.mmu().read_byte(state.start_pc);
    const std::uint8_t op1 = nes.mmu().read_byte(state.start_pc + 1u);
    const std::uint8_t op2 = nes.mmu().read_byte(state.start_pc + 2u);

    std::string result =
            fmt::format("{:04X}  {:02X}", state.start_pc, raw_opcode);

    const int arg_count =
            n_e_s::dis::get_arg_count(state.current_opcode->address_mode);
    if (arg_count >= 1) {
        result += fmt::format(" {:02X}", op1);
        if (arg_count >= 2) {
            result += fmt::format(" {:02X}", op2);
        } else {
            result += fmt::format("   ");
        }
    } else {
        result += fmt::format("      ");
    }
    result += fmt::format(" {}{}",
            is_undocumented(*state.current_opcode) ? "*" : " ",
            n_e_s::core::to_string(state.current_opcode->family));

    return result;
}